

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O0

void separate(vector<const_char_*,_std::allocator<const_char_*>_> *in,char *out,bool override)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  invalid_argument *this;
  char *pcVar5;
  MultiPartInputFile *this_00;
  ostream *poVar6;
  void *this_01;
  Header *pHVar7;
  string *psVar8;
  byte in_DL;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDI;
  string type;
  MultiPartOutputFile out_1;
  Header header;
  int p_1;
  ostringstream oss;
  string outfilename;
  int p;
  MultiPartInputFile temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fornamecheck;
  int numOutputs;
  MultiPartInputFile *inputimage;
  string filename;
  char *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  value_type *in_stack_fffffffffffffc38;
  ostream *in_stack_fffffffffffffc40;
  allocator<char> *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc98;
  ostream *in_stack_fffffffffffffca0;
  string local_2d8 [32];
  MultiPartOutputFile local_2b8 [16];
  Header local_2a8 [60];
  int local_26c;
  string local_250 [32];
  ostringstream local_230 [383];
  allocator<char> local_b1;
  string local_b0 [36];
  int local_8c;
  MultiPartInputFile local_88 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  int local_5c;
  MultiPartInputFile *local_58;
  allocator<char> local_49;
  string local_48 [55];
  byte local_11;
  
  local_11 = in_DL & 1;
  sVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RDI);
  if (sVar4 < 2) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RDI,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc70,
               (char *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
               in_stack_fffffffffffffc60);
    std::allocator<char>::~allocator(&local_49);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x10ba86);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_88,pcVar5,iVar3,true);
    this_00 = (MultiPartInputFile *)operator_new(0x10);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartInputFile::MultiPartInputFile(this_00,pcVar5,iVar3,true);
    local_58 = this_00;
    local_5c = Imf_3_2::MultiPartInputFile::parts();
    poVar6 = std::operator<<((ostream *)&std::cout,"numOutputs: ");
    this_01 = (void *)std::ostream::operator<<(poVar6,local_5c);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    for (local_8c = 0; local_8c < local_5c; local_8c = local_8c + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc70,
                 (char *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
                 in_stack_fffffffffffffc60);
      std::allocator<char>::~allocator(&local_b1);
      std::__cxx11::ostringstream::ostringstream(local_230);
      poVar6 = std::operator<<((ostream *)local_230,'.');
      std::ostream::operator<<(poVar6,local_8c + 1);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator+=(local_b0,local_250);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::string::operator+=(local_b0,".exr");
      poVar6 = std::operator<<((ostream *)&std::cout,"outputfilename: ");
      in_stack_fffffffffffffca0 = std::operator<<(poVar6,local_b0);
      std::ostream::operator<<(in_stack_fffffffffffffca0,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      std::__cxx11::ostringstream::~ostringstream(local_230);
      std::__cxx11::string::~string(local_b0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffc80,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RDI,0);
    filename_check((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc40);
    for (local_26c = 0; local_26c < local_5c; local_26c = local_26c + 1) {
      pHVar7 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_58);
      Imf_3_2::Header::Header(local_2a8,pHVar7);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_78,(long)local_26c);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar1 = local_11;
      iVar3 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                (local_2b8,pcVar5,local_2a8,1,(bool)(bVar1 & 1),iVar3);
      psVar8 = (string *)Imf_3_2::Header::type_abi_cxx11_();
      std::__cxx11::string::string(local_2d8,psVar8);
      bVar2 = std::operator==(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cout,"scanlineimage");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        copy_scanline((MultiPartInputFile *)in_stack_fffffffffffffc40,
                      (MultiPartOutputFile *)in_stack_fffffffffffffc38,
                      (int)((ulong)in_stack_fffffffffffffc30 >> 0x20),(int)in_stack_fffffffffffffc30
                     );
      }
      else {
        bVar2 = std::operator==(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        if (bVar2) {
          poVar6 = std::operator<<((ostream *)&std::cout,"tiledimage");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          copy_tile((MultiPartInputFile *)in_stack_fffffffffffffc40,
                    (MultiPartOutputFile *)in_stack_fffffffffffffc38,
                    (int)((ulong)in_stack_fffffffffffffc30 >> 0x20),(int)in_stack_fffffffffffffc30);
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          if (bVar2) {
            poVar6 = std::operator<<((ostream *)&std::cout,"deepscanline");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            copy_scanlinedeep((MultiPartInputFile *)in_stack_fffffffffffffc40,
                              (MultiPartOutputFile *)in_stack_fffffffffffffc38,
                              (int)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                              (int)in_stack_fffffffffffffc30);
          }
          else {
            bVar2 = std::operator==(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
            if (bVar2) {
              in_stack_fffffffffffffc40 = std::operator<<((ostream *)&std::cout,"deeptile");
              std::ostream::operator<<
                        (in_stack_fffffffffffffc40,std::endl<char,std::char_traits<char>>);
              copy_tiledeep((MultiPartInputFile *)in_stack_fffffffffffffc40,
                            (MultiPartOutputFile *)in_stack_fffffffffffffc38,
                            (int)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                            (int)in_stack_fffffffffffffc30);
            }
          }
        }
      }
      std::__cxx11::string::~string(local_2d8);
      Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(local_2b8);
      Imf_3_2::Header::~Header(local_2a8);
    }
    if (local_58 != (MultiPartInputFile *)0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"\n");
    poVar6 = std::operator<<(poVar6,"Separate Success");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc40);
    std::__cxx11::string::~string(local_48);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"-separate only take one input file");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
separate (vector<const char*> in, const char* out, bool override)
{
    if (in.size () > 1)
        throw invalid_argument("-separate only take one input file");

    //
    // parse the multipart input
    //
    string              filename (in[0]);
    MultiPartInputFile* inputimage;
    int                 numOutputs;
    vector<string>      fornamecheck;

    // add check for existence of the file
    MultiPartInputFile temp (filename.c_str ());

    inputimage = new MultiPartInputFile (filename.c_str ());
    numOutputs = inputimage->parts ();
    cout << "numOutputs: " << numOutputs << endl;

    //
    // set outputs names
    //
    for (int p = 0; p < numOutputs; p++)
    {
        string outfilename (out);

        //add number to outfilename
        std::ostringstream oss;
        oss << '.' << p + 1;
        outfilename += oss.str ();
        outfilename += ".exr";
        cout << "outputfilename: " << outfilename << endl;
        fornamecheck.push_back (outfilename);
    }

    filename_check (fornamecheck, in[0]);

    //
    // separate outputs
    //
    for (int p = 0; p < numOutputs; p++)
    {
        Header header = inputimage->header (p);

        MultiPartOutputFile out (
            fornamecheck[p].c_str (), &header, 1, override);

        std::string type = header.type ();
        if (type == "scanlineimage")
        {
            cout << "scanlineimage" << endl;
            copy_scanline (*inputimage, out, p, 0);
        }
        else if (type == "tiledimage")
        {
            cout << "tiledimage" << endl;
            copy_tile (*inputimage, out, p, 0);
        }
        else if (type == "deepscanline")
        {
            cout << "deepscanline" << endl;
            copy_scanlinedeep (*inputimage, out, p, 0);
        }
        else if (type == "deeptile")
        {
            cout << "deeptile" << endl;
            copy_tiledeep (*inputimage, out, p, 0);
        }
    }

    delete inputimage;
    cout << "\n"
         << "Separate Success" << endl;
}